

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent *indent)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_t sVar5;
  char *pcVar6;
  undefined3 in_register_00000089;
  const_iterator fi;
  pointer pbVar7;
  int iVar8;
  string stype;
  string local_80;
  undefined4 local_5c;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  cmInstallGenerator *local_38;
  
  local_5c = CONCAT31(in_register_00000089,optional);
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  pcVar6 = (char *)os;
  local_38 = this;
  if (type < (cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY)) {
    pcVar6 = (char *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)&local_58,0,(char *)0x0,
               (ulong)(&DAT_00504740 + *(int *)(&DAT_00504740 + (ulong)type * 4)));
  }
  if (0 < indent->Level) {
    iVar8 = 0;
    do {
      pcVar6 = " ";
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar8 = iVar8 + 1;
    } while (iVar8 < indent->Level);
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((dest->_M_dataplus)._M_p);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n",0x2d);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    pbVar7 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar7 != (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar7 != (files->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(dest->_M_dataplus)._M_p,dest->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        if ((rename == (char *)0x0) || (*rename == '\0')) {
          cmsys::SystemTools::GetFilenameName(&local_80,pbVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar5 = strlen(rename);
          std::__ostream_insert<char,std::char_traits<char>>(os,rename,sVar5);
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != (files->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\")\n",3);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n",0x2f);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
      if (0 < indent->Level) {
        iVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar8 = iVar8 + 1;
        } while (iVar8 < indent->Level);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(WARNING \"ABSOLUTE path INSTALL ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n",0x34);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n",0x30);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
      if (0 < indent->Level) {
        iVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar8 = iVar8 + 1;
        } while (iVar8 < indent->Level);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"DESTINATION forbidden (by caller): ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n",0x26);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    pcVar6 = "endif()\n";
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  }
  ConvertToAbsoluteDestination(&local_80,(cmInstallGenerator *)pcVar6,dest);
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(INSTALL DESTINATION \"",0x1a);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" TYPE ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
  if ((char)local_5c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," OPTIONAL",9);
  }
  uVar3 = local_38->Message - MessageAlways;
  if (uVar3 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_00504798 + *(int *)(&DAT_00504798 + (ulong)uVar3 * 4),
               *(long *)(&DAT_005047a8 + (ulong)uVar3 * 8));
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," PERMISSIONS",0xc);
    sVar5 = strlen(permissions_file);
    std::__ostream_insert<char,std::char_traits<char>>(os,permissions_file,sVar5);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," DIR_PERMISSIONS",0x10);
    sVar5 = strlen(permissions_dir);
    std::__ostream_insert<char,std::char_traits<char>>(os,permissions_dir,sVar5);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(os," RENAME \"",9);
    sVar5 = strlen(rename);
    std::__ostream_insert<char,std::char_traits<char>>(os,rename,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," FILES",6);
  pbVar7 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar1 - (long)pbVar7 == 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    pbVar7 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    pcVar6 = "\"";
LAB_002b7af0:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,1);
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_002b7b33;
  }
  else {
    if (pbVar7 != pbVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (0 < indent->Level) {
          iVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar8 = iVar8 + 1;
          } while (iVar8 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != (files->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    if (0 < indent->Level) {
      iVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + 1;
      } while (iVar8 < indent->Level);
    }
    pcVar6 = " ";
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    poVar4 = os;
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_002b7af0;
  }
  sVar5 = strlen(literal_args);
  std::__ostream_insert<char,std::char_traits<char>>(os,literal_args,sVar5);
LAB_002b7b33:
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void cmInstallGenerator
::AddInstallRule(
                 std::ostream& os,
                 std::string const& dest,
                 cmInstallType type,
                 std::vector<std::string> const& files,
                 bool optional /* = false */,
                 const char* permissions_file /* = 0 */,
                 const char* permissions_dir /* = 0 */,
                 const char* rename /* = 0 */,
                 const char* literal_args /* = 0 */,
                 Indent const& indent
                 )
{
  // Use the FILE command to install the file.
  std::string stype;
  switch(type)
    {
    case cmInstallType_DIRECTORY:      stype = "DIRECTORY"; break;
    case cmInstallType_PROGRAMS:       stype = "PROGRAM"; break;
    case cmInstallType_EXECUTABLE:     stype = "EXECUTABLE"; break;
    case cmInstallType_STATIC_LIBRARY: stype = "STATIC_LIBRARY"; break;
    case cmInstallType_SHARED_LIBRARY: stype = "SHARED_LIBRARY"; break;
    case cmInstallType_MODULE_LIBRARY: stype = "MODULE"; break;
    case cmInstallType_FILES:          stype = "FILE"; break;
    }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest.c_str()))
     {
     os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
     os << indent << " \"";
     for(std::vector<std::string>::const_iterator fi = files.begin();
               fi != files.end(); ++fi)
             {
               if (fi!=files.begin())
                 {
                 os << ";";
                 }
               os << dest << "/";
               if (rename && *rename)
                 {
                 os << rename;
                 }
               else
                 {
                 os << cmSystemTools::GetFilenameName(*fi);
                 }
             }
     os << "\")\n";
     os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
     os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
        << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
     os << indent << "endif()\n";

     os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
     os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
        << "DESTINATION forbidden (by caller): "
        << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
     os << indent << "endif()\n";
     }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if(optional)
    {
    os << " OPTIONAL";
    }
  switch(this->Message)
    {
    case MessageDefault: break;
    case MessageAlways: os << " MESSAGE_ALWAYS"; break;
    case MessageLazy:   os << " MESSAGE_LAZY"; break;
    case MessageNever:  os << " MESSAGE_NEVER"; break;
    }
  if(permissions_file && *permissions_file)
    {
    os << " PERMISSIONS" << permissions_file;
    }
  if(permissions_dir && *permissions_dir)
    {
    os << " DIR_PERMISSIONS" << permissions_dir;
    }
  if(rename && *rename)
    {
    os << " RENAME \"" << rename << "\"";
    }
  os << " FILES";
  if(files.size() == 1)
    {
    os << " \"" << files[0] << "\"";
    }
  else
    {
    for(std::vector<std::string>::const_iterator fi = files.begin();
        fi != files.end(); ++fi)
      {
      os << "\n" << indent << "  \"" << *fi << "\"";
      }
    os << "\n" << indent << " ";
    if(!(literal_args && *literal_args))
      {
      os << " ";
      }
    }
  if(literal_args && *literal_args)
    {
    os << literal_args;
    }
  os << ")\n";
}